

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

RequestDsl * __thiscall RequestDsl::header(RequestDsl *this,string *name,string *value)

{
  undefined1 local_60 [8];
  HeaderItem item;
  string *value_local;
  string *name_local;
  RequestDsl *this_local;
  
  item.value.field_2._8_8_ = value;
  std::__cxx11::string::string((string *)local_60,(string *)name);
  std::__cxx11::string::string
            ((string *)(item.name.field_2._M_local_buf + 8),(string *)item.value.field_2._8_8_);
  std::vector<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>::
  push_back(&(this->request).headers,(value_type *)local_60);
  httpparser::Request::HeaderItem::~HeaderItem((HeaderItem *)local_60);
  return this;
}

Assistant:

RequestDsl &header(const std::string &name, const std::string &value)
    {
        httpparser::Request::HeaderItem item = {name, value};
        request.headers.push_back(item);
        return *this; 
    }